

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O0

int __thiscall GF2::WW<66UL>::Compare(WW<66UL> *this,WW<66UL> *wRight)

{
  size_t pos;
  WW<66UL> *wRight_local;
  WW<66UL> *this_local;
  
  pos = 1;
  while( true ) {
    if (pos == 0xffffffffffffffff) {
      return 0;
    }
    if (wRight->_words[pos] < this->_words[pos]) break;
    if (this->_words[pos] < wRight->_words[pos]) {
      return -1;
    }
    pos = pos - 1;
  }
  return 1;
}

Assistant:

int Compare(const WW& wRight) const
	{
		for (size_t pos = _wcount - 1; pos != SIZE_MAX; --pos)
			if (_words[pos] > wRight._words[pos]) 
				return 1;
			else if (_words[pos] < wRight._words[pos]) 
				return -1;
		return 0;
	}